

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O2

bool __thiscall
Kernel::MatchingUtils::
matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
          (MatchingUtils *this,Term *base,Term *instance,Binder *binder)

{
  uint uVar1;
  sockaddr *__addr;
  uint uVar6;
  bool bVar2;
  int iVar3;
  TermList TVar4;
  TermList TVar5;
  MatchingUtils *pMVar7;
  TermList *pTVar8;
  Literal *l2;
  Literal *l1;
  TermList TVar9;
  
  if ((((*(ulong *)(this + 0x28) & 8) != 0) && ((base->_args[0]._content & 8) != 0)) &&
     (binder = (Binder *)(ulong)*(uint *)(this + 0x10), base->_weight < *(uint *)(this + 0x10))) {
    return false;
  }
  if (((*(ulong *)(this + 0x28) & 0x10) != 0) && (*(int *)(this + 0xc) < 0)) {
    pMVar7 = *(MatchingUtils **)(this + 0x20);
    TVar4 = SortHelper::getEqualityArgumentSort((Literal *)base);
    bVar2 = matchTerms<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
                      (pMVar7,TVar4,(TermList)instance,binder);
    if (!bVar2) {
      return false;
    }
  }
  uVar6 = *(uint *)(this + 0xc);
  uVar1 = *(uint *)&base->field_0xc;
  if ((matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder&)
       ::subterms == '\0') &&
     (iVar3 = __cxa_guard_acquire(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder&)
                                   ::subterms), iVar3 != 0)) {
    Lib::Stack<Kernel::TermList_*>::Stack
              (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
                ::subterms,0x20);
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,
                 &matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
                  ::subterms,&__dso_handle);
    __cxa_guard_release(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder&)
                         ::subterms);
  }
  pMVar7 = this + (ulong)(uVar6 & 0xfffffff) * 8 + 0x28;
  pTVar8 = base->_args + (uVar1 & 0xfffffff);
  matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>::
  subterms._cursor =
       matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
       ::subterms._stack;
  do {
    while( true ) {
      if ((*(uint *)(pMVar7 + -8) & 3) != 2) {
        Lib::Stack<Kernel::TermList_*>::push
                  (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
                    ::subterms,&((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar8 + -1))->_sort);
        Lib::Stack<Kernel::TermList_*>::push
                  (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
                    ::subterms,(TermList *)(pMVar7 + -8));
      }
      TVar4._content = *(uint64_t *)pMVar7;
      __addr = (sockaddr *)pTVar8->_content;
      TVar5._content = TVar4._content;
      TVar9._content = (uint64_t)__addr;
      if (((uint)TVar4._content & 3) != 3) break;
LAB_0029ab01:
      *(uint64_t *)(instance->_vptr_Term[6] + (TVar5._content & 0x3fffffffc) * 2) = TVar9._content;
LAB_0029ab19:
      if (matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
          ::subterms._cursor ==
          matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
          ::subterms._stack) {
        return true;
      }
      pMVar7 = (MatchingUtils *)
               matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
               ::subterms._cursor[-1];
      pTVar8 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
               ::subterms._cursor[-2];
      matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
      ::subterms._cursor =
           matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
           ::subterms._cursor + -2;
    }
    uVar6 = (uint)__addr & 3;
    TVar5._content = (uint64_t)__addr;
    TVar9._content = TVar4._content;
    if (uVar6 == 3) goto LAB_0029ab01;
    if ((TVar4._content & 3) != 0) {
      iVar3 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder
              ::bind((Binder *)instance,(int)(TVar4._content >> 2),__addr,uVar6);
      if ((char)iVar3 == '\0') {
        return false;
      }
      goto LAB_0029ab19;
    }
    if (((ulong)__addr & 3) != 0) {
      return false;
    }
    if (*(uint *)(TVar4._content + 8) != *(uint *)(__addr->sa_data + 6)) {
      return false;
    }
    if (((((TermList *)(TVar4._content + 0x28))->_content & 8) != 0) &&
       ((__addr[2].sa_data[6] & 8U) != 0)) {
      bVar2 = Term::ground((Term *)TVar4._content);
      if ((bVar2) && (*(uint64_t *)pMVar7 != pTVar8->_content)) {
        return false;
      }
      uVar6._0_2_ = __addr[1].sa_family;
      uVar6._2_1_ = __addr[1].sa_data[0];
      uVar6._3_1_ = __addr[1].sa_data[1];
      if (uVar6 < *(uint *)(TVar4._content + 0x10)) {
        return false;
      }
    }
    if ((*(uint *)(TVar4._content + 0xc) & 0xfffffff) == 0) goto LAB_0029ab19;
    pMVar7 = (MatchingUtils *)
             ((TermList *)(TVar4._content + 0x28) +
             ((ulong)*(uint *)(TVar4._content + 0xc) & 0xfffffff));
    pTVar8 = (TermList *)
             (__addr[2].sa_data + (ulong)(*(uint *)(__addr->sa_data + 10) & 0xfffffff) * 8 + 6);
  } while( true );
}

Assistant:

bool MatchingUtils::matchArgs(Term* base, Term* instance, Binder& binder)
{
  ASS_EQ(base->functor(),instance->functor());
  if(base->shared() && instance->shared()) {
    if(base->weight() > instance->weight()) {
      return false;
    }
  }
  // Note: while this function only cares about the term structure,
  // for two-variable equalities we need to get the sort of the arguments from the Literal object.
  if(base->isLiteral() && static_cast<Literal*>(base)->isTwoVarEquality()){
    Literal* l1 = static_cast<Literal*>(base);
    Literal* l2 = static_cast<Literal*>(instance);
    if(!matchTerms(l1->twoVarEqSort(), SortHelper::getEqualityArgumentSort(l2), binder)){
      return false;
    }
  }
  ASS_G(base->arity(),0);

  TermList* bt=base->args();
  TermList* it=instance->args();

  static Stack<TermList*> subterms(32);
  subterms.reset();

  for (;;) {
    if (!bt->next()->isEmpty()) {
      subterms.push(it->next());
      subterms.push(bt->next());
    }
    if(bt->isSpecialVar()) {
      binder.specVar(bt->var(), *it);
    } else if(it->isSpecialVar()) {
      binder.specVar(it->var(), *bt);
    } else if(bt->isTerm()) {
      if(!it->isTerm()) {
	return false;
      }
      Term* s = bt->term();
      Term* t = it->term();
      if(s->functor()!=t->functor()) {
	return false;
      }
      if(bt->term()->shared() && it->term()->shared()) {
	if(bt->term()->ground() && *bt!=*it) {
	  return false;
	}
	if(s->weight() > t->weight()) {
	  return false;
	}
      }
      if(s->arity() > 0) {
	bt = s->args();
	it = t->args();
	continue;
      }
    } else {
      ASS(bt->isOrdinaryVar());
      if(!binder.bind(bt->var(), *it)) {
	return false;
      }
    }
    if(subterms.isEmpty()) {
      return true;
    }
    bt = subterms.pop();
    it = subterms.pop();
  }
}